

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir-print.cc
# Opt level: O0

void __thiscall IR::Print::visit(Print *this,Move *m)

{
  basic_ostream<char,_std::char_traits<char>_> *os;
  Temp *pTVar1;
  string *args;
  string *args_1;
  Move *m_local;
  Print *this_local;
  
  os = this->out;
  pTVar1 = Move::target(m);
  args = Temp::name_abi_cxx11_(pTVar1);
  pTVar1 = Move::source(m);
  args_1 = Temp::name_abi_cxx11_(pTVar1);
  fmt::v7::print<char[11],std::__cxx11::string_const&,std::__cxx11::string_const&,char>
            (os,(char (*) [11])"{0} = {1};",args,args_1);
  std::ostream::operator<<(this->out,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Print::visit(IR::Move* m) {
  fmt::print(out, "{0} = {1};", m->target()->name(), m->source()->name());
  out << std::endl;
}